

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

char * __thiscall tinyxml2::StrPair::GetStr(StrPair *this)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  Entity *entity;
  int i;
  bool entityFound;
  char *adjusted;
  char local_2e [2];
  int len;
  char buf [10];
  int buflen;
  char *q;
  char *p;
  StrPair *this_local;
  
  if ((this->_flags & 0x100U) != 0) {
    *this->_end = '\0';
    this->_flags = this->_flags ^ 0x100;
    if (this->_flags != 0) {
      unique0x00012000 = this->_start;
      q = this->_start;
      while (q < this->_end) {
        if (((this->_flags & 2U) == 0) || (*q != '\r')) {
          if (((this->_flags & 2U) == 0) || (*q != '\n')) {
            if (((this->_flags & 1U) == 0) || (*q != '&')) {
              *stack0xffffffffffffffe0 = *q;
              register0x00000000 = stack0xffffffffffffffe0 + 1;
              q = q + 1;
            }
            else if (q[1] == '#') {
              buf[2] = '\n';
              buf[3] = '\0';
              buf[4] = '\0';
              buf[5] = '\0';
              memset(local_2e,0,10);
              adjusted._4_4_ = 0;
              pcVar3 = XMLUtil::GetCharacterRef(q,local_2e,(int *)((long)&adjusted + 4));
              if (pcVar3 == (char *)0x0) {
                *stack0xffffffffffffffe0 = *q;
                register0x00000000 = stack0xffffffffffffffe0 + 1;
                q = q + 1;
              }
              else {
                memcpy(stack0xffffffffffffffe0,local_2e,(long)adjusted._4_4_);
                register0x00000000 = stack0xffffffffffffffe0 + adjusted._4_4_;
                q = pcVar3;
              }
            }
            else {
              bVar1 = false;
              for (entity._0_4_ = 0; (int)entity < 5; entity._0_4_ = (int)entity + 1) {
                lVar4 = (long)(int)entity * 0x10;
                iVar2 = strncmp(q + 1,*(char **)(entities + lVar4),
                                (long)*(int *)(entities + lVar4 + 8));
                if ((iVar2 == 0) && (q[(long)*(int *)(entities + lVar4 + 8) + 1] == ';')) {
                  *stack0xffffffffffffffe0 = entities[lVar4 + 0xc];
                  register0x00000000 = stack0xffffffffffffffe0 + 1;
                  q = q + (*(int *)(entities + lVar4 + 8) + 2);
                  bVar1 = true;
                  break;
                }
              }
              if (!bVar1) {
                register0x00000000 = stack0xffffffffffffffe0 + 1;
                q = q + 1;
              }
            }
          }
          else {
            if (q[1] == '\r') {
              q = q + 2;
            }
            else {
              q = q + 1;
            }
            *stack0xffffffffffffffe0 = '\n';
            register0x00000000 = stack0xffffffffffffffe0 + 1;
          }
        }
        else {
          if (q[1] == '\n') {
            q = q + 2;
          }
          else {
            q = q + 1;
          }
          *stack0xffffffffffffffe0 = '\n';
          register0x00000000 = stack0xffffffffffffffe0 + 1;
        }
      }
      *stack0xffffffffffffffe0 = '\0';
    }
    if ((this->_flags & 4U) != 0) {
      CollapseWhitespace(this);
    }
    this->_flags = this->_flags & 0x200;
  }
  return this->_start;
}

Assistant:

const char* StrPair::GetStr()
{
    TIXMLASSERT(_start);
    TIXMLASSERT(_end);
    if (_flags & NEEDS_FLUSH) {
        *_end = 0;
        _flags ^= NEEDS_FLUSH;

        if (_flags) {
            const char* p = _start; // the read pointer
            char* q = _start; // the write pointer

            while (p < _end) {
                if ((_flags & NEEDS_NEWLINE_NORMALIZATION) && *p == CR) {
                    // CR-LF pair becomes LF
                    // CR alone becomes LF
                    // LF-CR becomes LF
                    if (*(p + 1) == LF) {
                        p += 2;
                    } else {
                        ++p;
                    }
                    *q = LF;
                    ++q;
                } else if ((_flags & NEEDS_NEWLINE_NORMALIZATION) && *p == LF) {
                    if (*(p + 1) == CR) {
                        p += 2;
                    } else {
                        ++p;
                    }
                    *q = LF;
                    ++q;
                } else if ((_flags & NEEDS_ENTITY_PROCESSING) && *p == '&') {
                    // Entities handled by tinyXML2:
                    // - special entities in the entity table [in/out]
                    // - numeric character reference [in]
                    //   &#20013; or &#x4e2d;

                    if (*(p + 1) == '#') {
                        const int buflen = 10;
                        char buf[buflen] = {0};
                        int len = 0;
                        const char* adjusted =
                            const_cast<char*>(XMLUtil::GetCharacterRef(p, buf, &len));
                        if (adjusted == 0) {
                            *q = *p;
                            ++p;
                            ++q;
                        } else {
                            TIXMLASSERT(0 <= len && len <= buflen);
                            TIXMLASSERT(q + len <= adjusted);
                            p = adjusted;
                            memcpy(q, buf, len);
                            q += len;
                        }
                    } else {
                        bool entityFound = false;
                        for (int i = 0; i < NUM_ENTITIES; ++i) {
                            const Entity& entity = entities[i];
                            if (strncmp(p + 1, entity.pattern, entity.length) == 0 &&
                                *(p + entity.length + 1) == ';') {
                                // Found an entity - convert.
                                *q = entity.value;
                                ++q;
                                p += entity.length + 2;
                                entityFound = true;
                                break;
                            }
                        }
                        if (!entityFound) {
                            // fixme: treat as error?
                            ++p;
                            ++q;
                        }
                    }
                } else {
                    *q = *p;
                    ++p;
                    ++q;
                }
            }
            *q = 0;
        }
        // The loop below has plenty going on, and this
        // is a less useful mode. Break it out.
        if (_flags & NEEDS_WHITESPACE_COLLAPSING) {
            CollapseWhitespace();
        }
        _flags = (_flags & NEEDS_DELETE);
    }
    TIXMLASSERT(_start);
    return _start;
}